

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSize __thiscall QDockAreaLayoutInfo::maximumSize(QDockAreaLayoutInfo *this)

{
  QSize QVar1;
  bool bVar2;
  bool bVar3;
  Orientation OVar4;
  QSize QVar5;
  QSize QVar6;
  ulong uVar7;
  Representation RVar8;
  Representation RVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  Representation RVar13;
  ulong uVar14;
  Representation RVar15;
  QDockAreaLayoutItem *this_00;
  ulong uVar16;
  uint local_54;
  
  uVar14 = 0xffffffffffffffff;
  lVar11 = 0;
  do {
    uVar14 = uVar14 + 1;
    if ((ulong)(this->item_list).d.size <= uVar14) {
      uVar14 = 0xffffff;
      uVar16 = 0xffffff;
      goto LAB_003edaaa;
    }
    bVar2 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&((this->item_list).d.ptr)->widgetItem + lVar11));
    lVar11 = lVar11 + 0x28;
  } while (bVar2);
  local_54 = 0;
  uVar12 = 0xffffff;
  uVar10 = 0;
  if (this->tabbed != false) {
    uVar10 = 0xffffff;
  }
  if ((this->item_list).d.size != 0) {
    lVar11 = 0;
    bVar2 = true;
    uVar14 = 0;
    local_54 = 0;
    do {
      this_00 = (QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar11);
      bVar3 = QDockAreaLayoutItem::skip(this_00);
      if (!bVar3) {
        QVar5 = QDockAreaLayoutItem::maximumSize(this_00);
        OVar4 = this->o;
        QVar6 = QDockAreaLayoutItem::minimumSize(this_00);
        QVar1 = (QSize)((ulong)QVar6 >> 0x20);
        if (OVar4 == Vertical) {
          QVar1 = QVar6;
        }
        RVar15.m_i = QVar1.wd.m_i.m_i;
        if (QVar1.wd.m_i.m_i < (int)local_54) {
          RVar15.m_i = local_54;
        }
        RVar13 = QVar5.ht.m_i;
        RVar9 = QVar5.wd.m_i;
        if (this->tabbed == true) {
          OVar4 = this->o;
          RVar8.m_i = RVar13.m_i;
          if (OVar4 == Horizontal) {
            RVar8.m_i = RVar9.m_i;
          }
          if (RVar8.m_i <= (int)uVar10) {
            uVar10 = RVar8.m_i;
          }
        }
        else {
          if (!bVar2) {
            uVar10 = uVar10 + *this->sep;
          }
          OVar4 = this->o;
          RVar8.m_i = RVar13.m_i;
          if (OVar4 == Horizontal) {
            RVar8.m_i = RVar9.m_i;
          }
          uVar10 = uVar10 + RVar8.m_i;
        }
        if (OVar4 == Vertical) {
          RVar13.m_i = RVar9.m_i;
        }
        if ((int)uVar12 < RVar13.m_i) {
          RVar13.m_i = uVar12;
        }
        uVar12 = RVar13.m_i;
        if (0xfffffe < (int)uVar10) {
          uVar10 = 0xffffff;
        }
        if (0xfffffe < (int)uVar12) {
          uVar12 = 0xffffff;
        }
        bVar2 = false;
        local_54 = RVar15.m_i;
      }
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x28;
    } while (uVar14 < (ulong)(this->item_list).d.size);
  }
  if ((int)local_54 < (int)uVar12) {
    local_54 = uVar12;
  }
  uVar16 = (ulong)local_54;
  uVar14 = uVar16;
  if (this->o == Horizontal) {
    uVar16 = (ulong)uVar10;
  }
  else if (this->o == Vertical) {
    uVar14 = (ulong)uVar10;
  }
  else {
    uVar16 = 0xffffffff;
  }
  bVar2 = updateTabBar(this);
  if (bVar2) {
    uVar7 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x70))();
  }
  else {
    uVar7 = 0;
  }
  if (uVar7 >> 0x20 != 0 || (int)uVar7 != 0) {
    if (this->tabBarShape - 2U < 2) {
      uVar16 = (ulong)(uint)((int)uVar16 + (int)uVar7);
    }
    else if ((uint)this->tabBarShape < 2) {
      uVar14 = (ulong)(uint)((int)uVar14 + (int)(uVar7 >> 0x20));
    }
  }
LAB_003edaaa:
  return (QSize)(uVar16 | uVar14 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::maximumSize() const
{
    if (isEmpty())
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

    int a = 0, b = QWIDGETSIZE_MAX;
#if QT_CONFIG(tabbar)
    if (tabbed)
        a = QWIDGETSIZE_MAX;
#endif

    int min_perp = 0;

    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize max_size = item.maximumSize();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMin(a, pick(o, max_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, max_size);
        }
        b = qMin(b, perp(o, max_size));

        a = qMin(a, int(QWIDGETSIZE_MAX));
        b = qMin(b, int(QWIDGETSIZE_MAX));

        first = false;
    }

    b = qMax(b, min_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbh = tabBarSizeHint();
    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
                result.rheight() += tbh.height();
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}